

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

void __thiscall ON_3dVector::Transform(ON_3dVector *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = this->x;
  dVar2 = this->y;
  dVar3 = this->z;
  dVar4 = xform->m_xform[2][1];
  dVar5 = xform->m_xform[2][0];
  dVar6 = xform->m_xform[2][2];
  dVar7 = xform->m_xform[1][1];
  dVar8 = xform->m_xform[1][0];
  dVar9 = xform->m_xform[1][2];
  this->x = dVar3 * xform->m_xform[0][2] +
            dVar1 * xform->m_xform[0][0] + xform->m_xform[0][1] * dVar2;
  this->y = dVar3 * dVar9 + dVar1 * dVar8 + dVar7 * dVar2;
  this->z = dVar6 * dVar3 + dVar5 * dVar1 + dVar4 * dVar2;
  return;
}

Assistant:

void ON_3dVector::Transform( const ON_Xform& xform )
{
  double xx,yy,zz;
  xx = xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][2]*z;
  yy = xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][2]*z;
  zz = xform.m_xform[2][0]*x + xform.m_xform[2][1]*y + xform.m_xform[2][2]*z;
  x = xx;
  y = yy;
  z = zz;
}